

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_post_edge_split(REF_GRID ref_grid,REF_INT node)

{
  uint uVar1;
  bool bVar2;
  int local_44;
  int local_3c;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL interior;
  REF_BOOL allowed;
  REF_NODE ref_node;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  _interior = ref_grid->node;
  ref_node._4_4_ = node;
  pRStack_18 = ref_grid;
  uVar1 = ref_smooth_local_cell_about(ref_grid->cell[8],_interior,node,&ref_private_macro_code_rss);
  if (uVar1 == 0) {
    if (ref_private_macro_code_rss == 0) {
      _interior->age[ref_node._4_4_] = _interior->age[ref_node._4_4_] + 1;
      ref_grid_local._4_4_ = 0;
    }
    else {
      if ((ref_node._4_4_ < 0) || (pRStack_18->cell[3]->ref_adj->nnode <= ref_node._4_4_)) {
        local_3c = -1;
      }
      else {
        local_3c = pRStack_18->cell[3]->ref_adj->first[ref_node._4_4_];
      }
      bVar2 = false;
      if (local_3c == -1) {
        if ((ref_node._4_4_ < 0) || (pRStack_18->cell[6]->ref_adj->nnode <= ref_node._4_4_)) {
          local_44 = -1;
        }
        else {
          local_44 = pRStack_18->cell[6]->ref_adj->first[ref_node._4_4_];
        }
        bVar2 = local_44 == -1;
      }
      if (bVar2) {
        uVar1 = ref_smooth_tet_improve(pRStack_18,ref_node._4_4_);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x7d3,"ref_smooth_post_edge_split",(ulong)uVar1,"ideal tet node");
          return uVar1;
        }
        _interior->age[ref_node._4_4_] = 0;
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x7ca,
           "ref_smooth_post_edge_split",(ulong)uVar1,"para");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_post_edge_split(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_BOOL allowed, interior;

  RSS(ref_smooth_local_cell_about(ref_grid_tet(ref_grid), ref_node, node,
                                  &allowed),
      "para");
  if (!allowed) {
    ref_node_age(ref_node, node)++;
    return REF_SUCCESS;
  }

  interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
             ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  if (interior) {
    RSS(ref_smooth_tet_improve(ref_grid, node), "ideal tet node");
    ref_node_age(ref_node, node) = 0;
  }

  return REF_SUCCESS;
}